

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjTransform(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int n,uchar **dstBufs,
               unsigned_long *dstSizes,tjtransform *t,int flags)

{
  j_decompress_ptr cinfo;
  long lVar1;
  JDIMENSION JVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  JDIMENSION *pJVar7;
  int iVar8;
  int jpegSubsamp;
  boolean bVar9;
  int iVar10;
  my_progress_mgr *pmVar11;
  jpeg_transform_info *__s;
  jvirt_barray_ptr *src_coef_arrays;
  unsigned_long uVar12;
  jvirt_barray_ptr *coef_arrays;
  undefined8 *puVar13;
  ulong uVar14;
  void *pvVar15;
  JDIMENSION *pJVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  jpeg_transform_info *pjVar20;
  uint uVar21;
  tjtransform *ptVar22;
  JCOPY_OPTION option;
  long lVar23;
  char *pcVar24;
  JCROP_CODE *pJVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  tjregion tVar30;
  tjregion tVar31;
  my_progress_mgr progress;
  
  if (handle == (tjhandle)0x0) {
    puVar13 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar13 + 7) = 0x656c646e616820;
    *puVar13 = 0x2064696c61766e49;
    return -1;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((~*(uint *)((long)handle + 0x600) & 3) != 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjTransform(): Instance has not been initialized for transformation",0x44);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar15 = (void *)__tls_get_addr(&PTR_0019df20);
    memcpy(pvVar15,"tjTransform(): Instance has not been initialized for transformation",0x44);
    uVar21 = 0xffffffff;
    iVar8 = 1;
    __s = (jpeg_transform_info *)0x0;
    goto LAB_0013c1b0;
  }
  auVar29._0_4_ = -(uint)(jpegBuf == (uchar *)0x0);
  auVar29._4_4_ = -(uint)(dstBufs == (uchar **)0x0);
  auVar29._8_4_ = -(uint)(dstSizes == (unsigned_long *)0x0);
  auVar29._12_4_ = -(uint)(t == (tjtransform *)0x0);
  iVar8 = movmskps(~*(uint *)((long)handle + 0x600),auVar29);
  if ((((iVar8 != 0) || (n < 1)) || (flags < 0)) || (jpegSize == 0)) {
    builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
    builtin_strncpy((char *)((long)handle + 0x610),"orm(): I",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar24 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar24,"tjTransform(): Invalid argument",0x20);
    uVar21 = 0xffffffff;
    iVar8 = 1;
    __s = (jpeg_transform_info *)0x0;
    goto LAB_0013c1b0;
  }
  if ((flags & 8U) == 0) {
    if ((flags & 0x10U) != 0) {
      pcVar24 = "JSIMD_FORCESSE=1";
      goto LAB_0013b8fe;
    }
    if ((flags & 0x20U) != 0) {
      pcVar24 = "JSIMD_FORCESSE2=1";
      goto LAB_0013b8fe;
    }
  }
  else {
    pcVar24 = "JSIMD_FORCEMMX=1";
LAB_0013b8fe:
    putenv(pcVar24);
  }
  if ((short)flags < 0) {
    pmVar11 = &progress;
    progress.pub.pass_counter = 0;
    progress.pub.pass_limit = 0;
    progress.pub.completed_passes = 0;
    progress.pub.total_passes = 0;
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = (tjinstance *)handle;
  }
  else {
    pmVar11 = (my_progress_mgr *)0x0;
  }
  *(my_progress_mgr **)((long)handle + 0x218) = pmVar11;
  __s = (jpeg_transform_info *)malloc((ulong)(uint)n * 0x78);
  if (__s == (jpeg_transform_info *)0x0) {
    builtin_strncpy((char *)((long)handle + 0x621),"ocation ",8);
    builtin_strncpy((char *)((long)handle + 0x629),"failure",8);
    builtin_strncpy((char *)((long)handle + 0x618),"emory al",8);
    builtin_strncpy((char *)((long)handle + 0x620),"location",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
    builtin_strncpy((char *)((long)handle + 0x610),"orm(): M",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar24 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar24,"tjTransform(): Memory allocation failure",0x29);
    uVar21 = 0xffffffff;
    iVar8 = 1;
    __s = (jpeg_transform_info *)0x0;
  }
  else {
    memset(__s,0,(ulong)(uint)n * 0x78);
    iVar8 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar8 == 0) {
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      option = JCOPYOPT_NONE;
      if (0 < n) {
        pJVar25 = &__s->crop_yoffset_set;
        uVar28 = 0;
        uVar14 = uVar28;
        do {
          uVar26 = (uint)uVar14;
          lVar27 = (long)*(int *)((long)&t->op + uVar28);
          ((jpeg_transform_info *)(pJVar25 + -0xd))->transform = xformtypes[lVar27];
          uVar21 = *(uint *)((long)&t->options + uVar28);
          pJVar25[-0xc] = uVar21 & 1;
          pJVar25[-0xb] = uVar21 >> 1 & 1;
          pJVar25[-10] = uVar21 >> 3 & 1;
          uVar19 = uVar21 >> 2 & 1;
          pJVar25[-9] = uVar19;
          pJVar25[-8] = (uint)(lVar27 == 1 && n != 1);
          if (uVar19 != 0) {
            pJVar25[-3] = *(JDIMENSION *)((long)&(t->r).x + uVar28);
            pJVar25[-2] = JCROP_POS;
            pJVar25[-1] = *(JDIMENSION *)((long)&(t->r).y + uVar28);
            *pJVar25 = JCROP_POS;
            JVar2 = *(JDIMENSION *)((long)&(t->r).w + uVar28);
            if (JVar2 == 0) {
              pJVar25[-7] = 0;
            }
            else {
              pJVar25[-7] = JVar2;
              pJVar25[-6] = JCROP_POS;
            }
            JVar2 = *(JDIMENSION *)((long)&(t->r).h + uVar28);
            if (JVar2 == 0) {
              pJVar25[-5] = 0;
            }
            else {
              pJVar25[-5] = JVar2;
              pJVar25[-4] = JCROP_POS;
            }
          }
          if ((uVar21 & 0x40) == 0) {
            uVar26 = 1;
          }
          pJVar25 = pJVar25 + 0x1e;
          uVar28 = uVar28 + 0x28;
          uVar14 = (ulong)uVar26;
        } while ((ulong)(uint)n * 0x28 != uVar28);
        option = (uint)(uVar26 != 0) * 2;
      }
      jcopy_markers_setup(cinfo,option);
      jpeg_read_header(cinfo,1);
      jpegSubsamp = getSubsamp(cinfo);
      if (jpegSubsamp < 0) {
        memcpy((void *)((long)handle + 0x608),
               "tjTransform(): Could not determine subsampling type for JPEG image",0x43);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pvVar15 = (void *)__tls_get_addr(&PTR_0019df20);
        memcpy(pvVar15,"tjTransform(): Could not determine subsampling type for JPEG image",0x43);
LAB_0013c1a2:
        iVar8 = 1;
        uVar21 = 0xffffffff;
      }
      else {
        if (0 < n) {
          lVar27 = 0;
          pjVar20 = __s;
          do {
            bVar9 = jtransform_request_workspace(cinfo,pjVar20);
            if (bVar9 == 0) {
              builtin_strncpy((char *)((long)handle + 0x618),"ransform",8);
              builtin_strncpy((char *)((long)handle + 0x620)," is not ",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
              builtin_strncpy((char *)((long)handle + 0x610),"orm(): T",8);
              *(undefined8 *)((long)handle + 0x628) = 0x74636566726570;
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              pcVar24 = (char *)__tls_get_addr(&PTR_0019df20);
              builtin_strncpy(pcVar24,"tjTransform(): Transform is not perfect",0x28);
              goto LAB_0013c1a2;
            }
            if ((pjVar20->crop != 0) &&
               ((*(int *)((long)&(t->r).x + lVar27) % pjVar20->iMCU_sample_width != 0 ||
                (*(int *)((long)&(t->r).y + lVar27) % pjVar20->iMCU_sample_height != 0)))) {
              snprintf((char *)((long)handle + 0x608),200,
                       "To crop this JPEG image, x must be a multiple of %d\nand y must be a multiple of %d.\n"
                       ,(ulong)(uint)pjVar20->iMCU_sample_width,
                       (ulong)(uint)pjVar20->iMCU_sample_height);
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              goto LAB_0013c1a2;
            }
            lVar27 = lVar27 + 0x28;
            pjVar20 = pjVar20 + 1;
          } while ((ulong)(uint)n * 0x28 != lVar27);
        }
        src_coef_arrays = jpeg_read_coefficients(cinfo);
        if (n < 1) {
          uVar21 = 0;
          iVar8 = 1;
        }
        else {
          pcVar24 = (char *)__tls_get_addr(&PTR_0019df20);
          iVar8 = 1;
          uVar28 = 0;
          uVar14 = uVar28;
          do {
            uVar21 = (uint)uVar14;
            pjVar20 = __s + uVar28;
            if (((uint)flags >> 10 & 1) != 0) {
              pJVar16 = &pjVar20->crop_width;
              pJVar7 = &pjVar20->crop_height;
              if (pjVar20->crop == 0) {
                pJVar16 = (JDIMENSION *)((long)handle + 0x238);
                pJVar7 = (JDIMENSION *)((long)handle + 0x23c);
              }
              uVar12 = tjBufSize(*pJVar16,*pJVar7,jpegSubsamp);
              dstSizes[uVar28] = uVar12;
              iVar8 = 0;
            }
            if ((t[uVar28].options & 0x10) == 0) {
              jpeg_mem_dest_tj((j_compress_ptr)handle,dstBufs + uVar28,dstSizes + uVar28,iVar8);
            }
            ptVar22 = t + uVar28;
            jpeg_copy_critical_parameters(cinfo,(j_compress_ptr)handle);
            coef_arrays = jtransform_adjust_parameters
                                    (cinfo,(j_compress_ptr)handle,src_coef_arrays,pjVar20);
            if ((((uint)flags >> 0xe & 1) != 0) || ((ptVar22->options & 0x20) != 0)) {
              jpeg_simple_progression((j_compress_ptr)handle);
            }
            if ((ptVar22->options & 0x10) == 0) {
              jpeg_write_coefficients((j_compress_ptr)handle,coef_arrays);
              jcopy_markers_execute
                        (cinfo,(j_compress_ptr)handle,(uint)~ptVar22->options >> 5 & JCOPYOPT_ALL);
            }
            else {
              jinit_c_master_control((j_compress_ptr)handle,1);
            }
            jtransform_execute_transform(cinfo,(j_compress_ptr)handle,src_coef_arrays,pjVar20);
            if (ptVar22->customFilter ==
                (_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr *)0x0) {
LAB_0013c013:
              bVar6 = false;
              if ((ptVar22->options & 0x10) == 0) {
                jpeg_finish_compress((j_compress_ptr)handle);
              }
              uVar14 = (ulong)uVar21;
            }
            else {
              if (*(int *)((long)handle + 0x4c) < 1) {
                bVar6 = false;
              }
              else {
                lVar27 = 0;
                do {
                  lVar17 = *(long *)((long)handle + 0x58);
                  lVar23 = lVar27 * 0x60;
                  uVar19 = *(uint *)(lVar17 + 0x20 + lVar23);
                  if (uVar19 == 0) {
                    bVar6 = false;
                    uVar14 = (ulong)uVar21;
                  }
                  else {
                    lVar1 = lVar17 + lVar23;
                    uVar14 = (ulong)(uint)(*(int *)(lVar17 + 0x1c + lVar23) << 3);
                    uVar18 = (ulong)uVar19 << 0x23 | uVar14;
                    tVar30._8_8_ = uVar14 | 0x800000000;
                    uVar19 = 0;
                    lVar17 = 0;
                    do {
                      puVar13 = (undefined8 *)
                                (**(code **)(*(long *)((long)handle + 0x210) + 0x40))
                                          (cinfo,coef_arrays[lVar27],uVar19,
                                           *(undefined4 *)(lVar1 + 0xc),1);
                      bVar3 = 0 < *(int *)(lVar1 + 0xc);
                      if (*(int *)(lVar1 + 0xc) < 1) {
                        uVar14 = (ulong)uVar21;
                        bVar6 = false;
                      }
                      else {
                        tVar30.x = (int)lVar17;
                        tVar30.y = (int)((ulong)lVar17 >> 0x20);
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = uVar18;
                        iVar10 = (*ptVar22->customFilter)
                                           ((short *)*puVar13,tVar30,(tjregion)(auVar4 << 0x40),
                                            (int)lVar27,(int)uVar28,ptVar22);
                        if (iVar10 != -1) {
                          lVar23 = 1;
                          do {
                            lVar17 = lVar17 + 0x800000000;
                            bVar3 = lVar23 < *(int *)(lVar1 + 0xc);
                            if (*(int *)(lVar1 + 0xc) <= lVar23) {
                              uVar14 = (ulong)uVar21;
                              bVar6 = false;
                              goto LAB_0013bfa6;
                            }
                            tVar31.w = (int)tVar30._8_8_;
                            tVar31.h = (int)(tVar30._8_8_ >> 0x20);
                            tVar31._0_8_ = lVar17;
                            auVar5._8_8_ = 0;
                            auVar5._0_8_ = uVar18;
                            iVar10 = (*ptVar22->customFilter)
                                               ((short *)puVar13[lVar23],tVar31,
                                                (tjregion)(auVar5 << 0x40),(int)lVar27,(int)uVar28,
                                                ptVar22);
                            lVar23 = lVar23 + 1;
                          } while (iVar10 != -1);
                        }
                        builtin_strncpy((char *)((long)handle + 0x618),"rror in ",8);
                        builtin_strncpy((char *)((long)handle + 0x620),"custom f",8);
                        builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
                        builtin_strncpy((char *)((long)handle + 0x610),"orm(): E",8);
                        *(undefined8 *)((long)handle + 0x626) = 0x7265746c696620;
                        *(undefined4 *)((long)handle + 0x6d0) = 1;
                        builtin_strncpy(pcVar24,"tjTransform(): Error in custom filter",0x26);
                        bVar6 = true;
                        uVar14 = 0xffffffff;
                      }
LAB_0013bfa6:
                      if (bVar3) goto LAB_0013bfd9;
                      uVar19 = uVar19 + *(int *)(lVar1 + 0xc);
                      uVar21 = (uint)uVar14;
                    } while (uVar19 < *(uint *)(lVar1 + 0x20));
                    bVar6 = false;
                  }
LAB_0013bfd9:
                  if (bVar6) goto LAB_0013c00a;
                  lVar27 = lVar27 + 1;
                  uVar21 = (uint)uVar14;
                } while (lVar27 < *(int *)((long)handle + 0x4c));
                bVar6 = false;
              }
LAB_0013c00a:
              uVar21 = (uint)uVar14;
              if (!bVar6) goto LAB_0013c013;
            }
            uVar21 = (uint)uVar14;
            if (bVar6) {
              if (!bVar6) {
                return uVar21;
              }
              goto LAB_0013c1b0;
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != (uint)n);
        }
        jpeg_finish_decompress(cinfo);
      }
    }
    else {
      iVar8 = 1;
      uVar21 = 0xffffffff;
    }
  }
LAB_0013c1b0:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (iVar8 != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(__s);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar21;
}

Assistant:

DLLEXPORT int tjTransform(tjhandle handle, const unsigned char *jpegBuf,
                          unsigned long jpegSize, int n,
                          unsigned char **dstBufs, unsigned long *dstSizes,
                          tjtransform *t, int flags)
{
  jpeg_transform_info *xinfo = NULL;
  jvirt_barray_ptr *srccoefs, *dstcoefs;
  int retval = 0, alloc = 1, i, jpegSubsamp, saveMarkers = 0;
  struct my_progress_mgr progress;

  GET_INSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0 || (this->init & DECOMPRESS) == 0)
    THROW("tjTransform(): Instance has not been initialized for transformation");

  if (jpegBuf == NULL || jpegSize <= 0 || n < 1 || dstBufs == NULL ||
      dstSizes == NULL || t == NULL || flags < 0)
    THROW("tjTransform(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if ((xinfo =
       (jpeg_transform_info *)malloc(sizeof(jpeg_transform_info) * n)) == NULL)
    THROW("tjTransform(): Memory allocation failure");
  MEMZERO(xinfo, sizeof(jpeg_transform_info) * n);

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);

  for (i = 0; i < n; i++) {
    xinfo[i].transform = xformtypes[t[i].op];
    xinfo[i].perfect = (t[i].options & TJXOPT_PERFECT) ? 1 : 0;
    xinfo[i].trim = (t[i].options & TJXOPT_TRIM) ? 1 : 0;
    xinfo[i].force_grayscale = (t[i].options & TJXOPT_GRAY) ? 1 : 0;
    xinfo[i].crop = (t[i].options & TJXOPT_CROP) ? 1 : 0;
    if (n != 1 && t[i].op == TJXOP_HFLIP) xinfo[i].slow_hflip = 1;
    else xinfo[i].slow_hflip = 0;

    if (xinfo[i].crop) {
      xinfo[i].crop_xoffset = t[i].r.x;  xinfo[i].crop_xoffset_set = JCROP_POS;
      xinfo[i].crop_yoffset = t[i].r.y;  xinfo[i].crop_yoffset_set = JCROP_POS;
      if (t[i].r.w != 0) {
        xinfo[i].crop_width = t[i].r.w;  xinfo[i].crop_width_set = JCROP_POS;
      } else
        xinfo[i].crop_width = JCROP_UNSET;
      if (t[i].r.h != 0) {
        xinfo[i].crop_height = t[i].r.h;  xinfo[i].crop_height_set = JCROP_POS;
      } else
        xinfo[i].crop_height = JCROP_UNSET;
    }
    if (!(t[i].options & TJXOPT_COPYNONE)) saveMarkers = 1;
  }

  jcopy_markers_setup(dinfo, saveMarkers ? JCOPYOPT_ALL : JCOPYOPT_NONE);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjTransform(): Could not determine subsampling type for JPEG image");

  for (i = 0; i < n; i++) {
    if (!jtransform_request_workspace(dinfo, &xinfo[i]))
      THROW("tjTransform(): Transform is not perfect");

    if (xinfo[i].crop) {
      if ((t[i].r.x % xinfo[i].iMCU_sample_width) != 0 ||
          (t[i].r.y % xinfo[i].iMCU_sample_height) != 0) {
        snprintf(this->errStr, JMSG_LENGTH_MAX,
                 "To crop this JPEG image, x must be a multiple of %d\n"
                 "and y must be a multiple of %d.\n",
                 xinfo[i].iMCU_sample_width, xinfo[i].iMCU_sample_height);
        this->isInstanceError = TRUE;
        retval = -1;  goto bailout;
      }
    }
  }

  srccoefs = jpeg_read_coefficients(dinfo);

  for (i = 0; i < n; i++) {
    int w, h;

    if (!xinfo[i].crop) {
      w = dinfo->image_width;  h = dinfo->image_height;
    } else {
      w = xinfo[i].crop_width;  h = xinfo[i].crop_height;
    }
    if (flags & TJFLAG_NOREALLOC) {
      alloc = 0;  dstSizes[i] = tjBufSize(w, h, jpegSubsamp);
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT))
      jpeg_mem_dest_tj(cinfo, &dstBufs[i], &dstSizes[i], alloc);
    jpeg_copy_critical_parameters(dinfo, cinfo);
    dstcoefs = jtransform_adjust_parameters(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (flags & TJFLAG_PROGRESSIVE || t[i].options & TJXOPT_PROGRESSIVE)
      jpeg_simple_progression(cinfo);
    if (!(t[i].options & TJXOPT_NOOUTPUT)) {
      jpeg_write_coefficients(cinfo, dstcoefs);
      jcopy_markers_execute(dinfo, cinfo, t[i].options & TJXOPT_COPYNONE ?
                                          JCOPYOPT_NONE : JCOPYOPT_ALL);
    } else
      jinit_c_master_control(cinfo, TRUE);
    jtransform_execute_transformation(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (t[i].customFilter) {
      int ci, y;
      JDIMENSION by;

      for (ci = 0; ci < cinfo->num_components; ci++) {
        jpeg_component_info *compptr = &cinfo->comp_info[ci];
        tjregion arrayRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE, DCTSIZE
        };
        tjregion planeRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE,
          compptr->height_in_blocks * DCTSIZE
        };

        for (by = 0; by < compptr->height_in_blocks;
             by += compptr->v_samp_factor) {
          JBLOCKARRAY barray = (dinfo->mem->access_virt_barray)
            ((j_common_ptr)dinfo, dstcoefs[ci], by, compptr->v_samp_factor,
             TRUE);

          for (y = 0; y < compptr->v_samp_factor; y++) {
            if (t[i].customFilter(barray[y][0], arrayRegion, planeRegion, ci,
                                  i, &t[i]) == -1)
              THROW("tjTransform(): Error in custom filter");
            arrayRegion.y += DCTSIZE;
          }
        }
      }
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT)) jpeg_finish_compress(cinfo);
  }

  jpeg_finish_decompress(dinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(xinfo);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}